

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CTypeID lj_ctype_getname(CTState *cts,CType **ctp,GCstr *name,uint32_t tmask)

{
  ushort uVar1;
  CType *pCVar2;
  uint uVar3;
  uint uVar4;
  CType *pCVar5;
  
  uVar3 = (uint)name + 0xfb3ee249;
  uVar4 = (uVar3 ^ (uint)name) - (uVar3 * 0x4000 | uVar3 >> 0x12);
  pCVar2 = cts->tab;
  uVar1 = cts->hash[(uVar3 >> 0xd ^ uVar4) - (uVar4 >> 0x13) & 0x7f];
  while (uVar3 = (uint)uVar1, uVar1 != 0) {
    pCVar5 = pCVar2 + uVar1;
    if (((GCstr *)(ulong)pCVar2[uVar1].name.gcptr32 == name) &&
       ((tmask >> (pCVar5->info >> 0x1c) & 1) != 0)) goto LAB_0013d07c;
    uVar1 = pCVar5->next;
  }
  uVar3 = 0;
  pCVar5 = pCVar2;
LAB_0013d07c:
  *ctp = pCVar5;
  return uVar3;
}

Assistant:

CTypeID lj_ctype_getname(CTState *cts, CType **ctp, GCstr *name, uint32_t tmask)
{
  CTypeID id = cts->hash[ct_hashname(name)];
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (gcref(ct->name) == obj2gco(name) &&
	((tmask >> ctype_type(ct->info)) & 1)) {
      *ctp = ct;
      return id;
    }
    id = ct->next;
  }
  *ctp = &cts->tab[0];  /* Simplify caller logic. ctype_get() would assert. */
  return 0;
}